

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::IsInfiniteFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  initializer_list<duckdb::LogicalType> iVar3;
  initializer_list<duckdb::LogicalType> iVar4;
  initializer_list<duckdb::LogicalType> iVar5;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *funcs;
  allocator_type *in_stack_fffffffffffff518;
  ScalarFunction *pSVar6;
  ScalarFunction *pSVar7;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff520;
  ScalarFunction *pSVar8;
  ScalarFunction *pSVar9;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffff528;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *p_Var10;
  undefined4 in_stack_fffffffffffff530;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff534;
  LogicalTypeId in_stack_fffffffffffff53f;
  LogicalType *in_stack_fffffffffffff540;
  LogicalType *pLVar12;
  string *in_stack_fffffffffffff558;
  ScalarFunctionSet *in_stack_fffffffffffff560;
  undefined1 ***local_9d8;
  bind_scalar_function_extended_t in_stack_fffffffffffff640;
  undefined1 **bind_extended;
  bind_scalar_function_t in_stack_fffffffffffff648;
  undefined1 **bind;
  scalar_function_t *in_stack_fffffffffffff650;
  scalar_function_t *function;
  LogicalType *in_stack_fffffffffffff658;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff660;
  ScalarFunction *in_stack_fffffffffffff668;
  ScalarFunction *this;
  undefined1 ***local_978;
  function_statistics_t in_stack_fffffffffffff6a0;
  undefined1 ***statistics;
  init_local_state_t in_stack_fffffffffffff6a8;
  undefined1 ***init_local_state;
  LogicalType *varargs;
  FunctionStability side_effects;
  ScalarFunctionSet *pSVar13;
  allocator *bind_lambda;
  undefined1 **local_8d0 [3];
  undefined8 **local_8b8;
  undefined8 local_8b0;
  undefined1 local_768 [87];
  undefined1 local_711 [33];
  undefined1 *local_6f0;
  undefined8 local_6e8;
  undefined1 local_5a0 [88];
  undefined1 *local_548;
  undefined1 local_540 [360];
  undefined1 local_3d8 [88];
  undefined8 **local_380;
  undefined1 **local_378 [3];
  undefined8 **local_360;
  undefined8 local_358;
  undefined1 local_210 [87];
  undefined1 local_1b9 [9];
  undefined1 **local_1b0 [3];
  undefined1 **local_198;
  undefined8 local_190;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  bind_lambda = &local_31;
  pSVar13 = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"isinf",bind_lambda);
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_1b9._1_8_ = local_1b0;
  LogicalType::LogicalType(in_stack_fffffffffffff540,in_stack_fffffffffffff53f);
  local_198 = (undefined1 **)local_1b0;
  local_190 = 1;
  varargs = (LogicalType *)local_1b9;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x207769b);
  iVar1._M_len._0_4_ = in_stack_fffffffffffff530;
  iVar1._M_array = (iterator)in_stack_fffffffffffff528;
  iVar1._M_len._4_4_ = in_stack_fffffffffffff534;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffff520,iVar1,in_stack_fffffffffffff518);
  LogicalType::LogicalType(in_stack_fffffffffffff540,in_stack_fffffffffffff53f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),in_stack_fffffffffffff528
            );
  LogicalType::LogicalType(in_stack_fffffffffffff540,in_stack_fffffffffffff53f);
  p_Var10 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_210;
  pLVar12 = (LogicalType *)0x0;
  uVar11 = 0;
  pSVar8 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
             in_stack_fffffffffffff6a0,in_stack_fffffffffffff6a8,varargs,(FunctionStability)in_RDI,
             (FunctionNullHandling)pSVar13,(bind_lambda_function_t)bind_lambda);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar8,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar8);
  LogicalType::~LogicalType((LogicalType *)0x207778f);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x207779c);
  LogicalType::~LogicalType((LogicalType *)0x20777a9);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20777b6);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x20777c3);
  statistics = local_1b0;
  init_local_state = &local_198;
  do {
    init_local_state = init_local_state + -3;
    LogicalType::~LogicalType((LogicalType *)0x20777f8);
  } while (init_local_state != statistics);
  local_380 = local_378;
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  local_360 = local_378;
  local_358 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2077862);
  iVar2._M_len._0_4_ = uVar11;
  iVar2._M_array = (iterator)p_Var10;
  iVar2._M_len._4_4_ = in_stack_fffffffffffff534;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar8,iVar2,(allocator_type *)pSVar6);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff534,uVar11),p_Var10);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  p_Var10 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_3d8;
  pLVar12 = (LogicalType *)0x0;
  uVar11 = 0;
  pSVar8 = (ScalarFunction *)0x0;
  pSVar6 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
             (function_statistics_t)statistics,(init_local_state_t)init_local_state,varargs,
             (FunctionStability)in_RDI,(FunctionNullHandling)pSVar13,
             (bind_lambda_function_t)bind_lambda);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar8,pSVar6);
  ScalarFunction::~ScalarFunction(pSVar8);
  LogicalType::~LogicalType((LogicalType *)0x2077956);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2077963);
  LogicalType::~LogicalType((LogicalType *)0x2077970);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x207797d);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x207798a);
  local_978 = (undefined1 ***)&local_360;
  do {
    local_978 = local_978 + -3;
    LogicalType::~LogicalType((LogicalType *)0x20779bf);
  } while (local_978 != local_378);
  local_548 = local_540;
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  local_540._24_8_ = local_540;
  local_540._32_8_ = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2077a29);
  iVar3._M_len._0_4_ = uVar11;
  iVar3._M_array = (iterator)p_Var10;
  iVar3._M_len._4_4_ = in_stack_fffffffffffff534;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar8,iVar3,(allocator_type *)pSVar6);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff534,uVar11),p_Var10);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  p_Var10 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_5a0;
  pLVar12 = (LogicalType *)0x0;
  uVar11 = 0;
  pSVar9 = (ScalarFunction *)0x0;
  pSVar7 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658,
             in_stack_fffffffffffff650,in_stack_fffffffffffff648,in_stack_fffffffffffff640,
             (function_statistics_t)statistics,(init_local_state_t)init_local_state,varargs,
             (FunctionStability)in_RDI,(FunctionNullHandling)pSVar13,
             (bind_lambda_function_t)bind_lambda);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar9,pSVar7);
  ScalarFunction::~ScalarFunction(pSVar9);
  LogicalType::~LogicalType((LogicalType *)0x2077b1d);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2077b2a);
  LogicalType::~LogicalType((LogicalType *)0x2077b37);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2077b44);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2077b51);
  pSVar6 = (ScalarFunction *)local_540;
  pSVar8 = (ScalarFunction *)(local_540 + 0x18);
  do {
    pSVar8 = (ScalarFunction *)&pSVar8[-1].deserialize;
    LogicalType::~LogicalType((LogicalType *)0x2077b86);
  } while (pSVar8 != pSVar6);
  local_711._1_8_ = local_711 + 9;
  this = pSVar8;
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  local_6f0 = local_711 + 9;
  local_6e8 = 1;
  function = (scalar_function_t *)local_711;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2077bf0);
  iVar4._M_len._0_4_ = uVar11;
  iVar4._M_array = (iterator)p_Var10;
  iVar4._M_len._4_4_ = in_stack_fffffffffffff534;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar9,iVar4,(allocator_type *)pSVar7);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff534,uVar11),p_Var10);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  p_Var10 = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_768;
  pLVar12 = (LogicalType *)0x0;
  uVar11 = 0;
  pSVar9 = (ScalarFunction *)0x0;
  pSVar7 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this,(vector<duckdb::LogicalType,_true> *)pSVar6,(LogicalType *)pSVar8,function,
             in_stack_fffffffffffff648,in_stack_fffffffffffff640,(function_statistics_t)statistics,
             (init_local_state_t)init_local_state,varargs,(FunctionStability)in_RDI,
             (FunctionNullHandling)pSVar13,(bind_lambda_function_t)bind_lambda);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar9,pSVar7);
  ScalarFunction::~ScalarFunction(pSVar9);
  LogicalType::~LogicalType((LogicalType *)0x2077ce4);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2077cf1);
  LogicalType::~LogicalType((LogicalType *)0x2077cfe);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2077d0b);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2077d18);
  bind_extended = (undefined1 **)(local_711 + 9);
  bind = &local_6f0;
  do {
    bind = bind + -3;
    LogicalType::~LogicalType((LogicalType *)0x2077d4d);
    side_effects = (FunctionStability)in_RDI;
  } while (bind != bind_extended);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  local_8b8 = local_8d0;
  local_8b0 = 1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2077db7);
  iVar5._M_len._0_4_ = uVar11;
  iVar5._M_array = (iterator)p_Var10;
  iVar5._M_len._4_4_ = in_stack_fffffffffffff534;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar9,iVar5,(allocator_type *)pSVar7);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffff534,uVar11),p_Var10);
  LogicalType::LogicalType(pLVar12,in_stack_fffffffffffff53f);
  pSVar9 = (ScalarFunction *)0x0;
  pSVar7 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (this,(vector<duckdb::LogicalType,_true> *)pSVar6,(LogicalType *)pSVar8,function,
             (bind_scalar_function_t)bind,(bind_scalar_function_extended_t)bind_extended,
             (function_statistics_t)statistics,(init_local_state_t)init_local_state,varargs,
             side_effects,(FunctionNullHandling)pSVar13,(bind_lambda_function_t)bind_lambda);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar9,pSVar7);
  ScalarFunction::~ScalarFunction(pSVar9);
  LogicalType::~LogicalType((LogicalType *)0x2077eab);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2077eb8);
  LogicalType::~LogicalType((LogicalType *)0x2077ec5);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x2077ed2);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2077edf);
  local_9d8 = (undefined1 ***)&local_8b8;
  do {
    local_9d8 = local_9d8 + -3;
    LogicalType::~LogicalType((LogicalType *)0x2077f14);
  } while (local_9d8 != local_8d0);
  return pSVar13;
}

Assistant:

ScalarFunctionSet IsInfiniteFun::GetFunctions() {
	ScalarFunctionSet funcs("isinf");
	funcs.AddFunction(ScalarFunction({LogicalType::FLOAT}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<float, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<double, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DATE}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<date_t, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsInfiniteOperator>));
	funcs.AddFunction(ScalarFunction({LogicalType::TIMESTAMP_TZ}, LogicalType::BOOLEAN,
	                                 ScalarFunction::UnaryFunction<timestamp_t, bool, IsInfiniteOperator>));
	return funcs;
}